

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O0

void * gutil::anon_unknown_0::ptfct(void *fa)

{
  long in_RDI;
  ThreadData *p;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x10))();
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x18))
              (*(undefined8 **)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x20),
               *(undefined8 *)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x30));
  }
  return (void *)0x0;
}

Assistant:

void *ptfct(void *fa)
{
  ThreadData *p=reinterpret_cast<ThreadData *>(fa);

  if (p->tfct != 0)
  {
    p->tfct->run();
  }

  if (p->pfct != 0)
  {
    p->pfct->run(p->start, p->end, p->step);
  }

  return 0;
}